

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O1

bool __thiscall
OpenMD::FragmentStamp::isAtomInRigidBody
          (FragmentStamp *this,int atomIndex,int *whichRigidBody,int *consAtomIndex)

{
  int iVar1;
  RigidBodyStamp *pRVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  *whichRigidBody = -1;
  *consAtomIndex = -1;
  iVar1 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[atomIndex];
  if (-1 < (long)iVar1) {
    *whichRigidBody = iVar1;
    pRVar2 = (this->rigidBodyStamps_).
             super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar1];
    lVar3 = *(long *)&(pRVar2->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    uVar5 = (long)*(pointer *)
                   ((long)&(pRVar2->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                   + 8) - lVar3 >> 2;
    uVar4 = (uint)uVar5;
    bVar7 = 0 < (int)uVar4;
    if (0 < (int)uVar4) {
      uVar6 = 0;
      do {
        if (uVar5 == uVar6) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar5);
        }
        if (*(int *)(lVar3 + uVar6 * 4) == atomIndex) {
          *consAtomIndex = (int)uVar6;
          if (!bVar7) {
            return false;
          }
          return true;
        }
        uVar6 = uVar6 + 1;
        bVar7 = uVar6 < (uVar4 & 0x7fffffff);
      } while (uVar6 != (uVar4 & 0x7fffffff));
    }
  }
  return false;
}

Assistant:

bool FragmentStamp::isAtomInRigidBody(int atomIndex, int& whichRigidBody,
                                        int& consAtomIndex) {
    whichRigidBody = -1;
    consAtomIndex  = -1;

    if (atom2Rigidbody[atomIndex] >= 0) {
      whichRigidBody          = atom2Rigidbody[atomIndex];
      RigidBodyStamp* rbStamp = getRigidBodyStamp(whichRigidBody);
      int numAtom             = rbStamp->getNMembers();
      for (int j = 0; j < numAtom; j++) {
        if (rbStamp->getMemberAt(j) == atomIndex) {
          consAtomIndex = j;
          return true;
        }
      }
    }

    return false;
  }